

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O1

void Game::tumbleTilesDownOnGameboard(GameBoard *gb)

{
  unsigned_long uVar1;
  ull uVar2;
  bool bVar3;
  ull *puVar4;
  undefined8 uVar5;
  tile_t *ptVar6;
  point2D_t *pt;
  ulong uVar7;
  pointer ptVar8;
  tile_t *ptVar9;
  uint local_b0;
  pointer local_a8;
  undefined1 local_88 [16];
  pointer local_78;
  _Head_base<0UL,_unsigned_long,_false> local_70;
  long local_60;
  unsigned_long local_58;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_50;
  unsigned_long local_38;
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_50,(vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)gb);
  uVar1 = (gb->gbda).
          super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  local_38 = uVar1;
  if (local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_b0 = (uint)uVar1;
  if (0 < (int)local_b0) {
    local_a8 = (pointer)(ulong)(local_b0 - 2);
    puVar4 = &local_a8->value;
    uVar7 = 0;
    do {
      ptVar8 = local_a8;
      ptVar9 = (tile_t *)((long)puVar4 + 1);
      if (local_b0 != 1) {
        do {
          std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
                    ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_70,
                     (vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)gb);
          local_58 = (gb->gbda).
                     super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                     .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
          local_88._0_8_ = ptVar8;
          ptVar6 = anon_unknown_0::gameboard_data_point_t::operator()
                             ((gameboard_data_point_t *)&local_70,(gameboard_data_array_t *)local_88
                              ,pt);
          uVar2 = ptVar6->value;
          if ((void *)local_70._M_head_impl != (void *)0x0) {
            operator_delete((void *)local_70._M_head_impl,local_60 - local_70._M_head_impl);
          }
          if (uVar2 != 0) {
            local_78 = (pointer)0x1;
            local_88._8_8_ = ptVar8;
            anon_unknown_0::moveOnGameboard(gb,(delta_t *)(local_88 + 8));
          }
          uVar5 = ptVar9 + 0xffffffffffffffff;
          bVar3 = 0 < (long)ptVar9;
          ptVar8 = (pointer)&ptVar8[-1].field_0xf;
          ptVar9 = (tile_t *)(uVar5 + 0xf);
        } while ((tile_t *)(uVar5 + 0xf) != (tile_t *)0x0 && bVar3);
      }
      uVar7 = uVar7 + 1;
      local_a8 = local_a8 + 0x10000000;
    } while (uVar7 != (local_b0 & 0x7fffffff));
  }
  return;
}

Assistant:

void tumbleTilesDownOnGameboard(GameBoard &gb) {
  doTumbleTilesDownOnGameboard(gb);
}